

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
               (string *s,char *fmt,Vector3<float> *v,float *args,char **args_1,char **args_2,
               Vector3<float> *args_3,Vector3<float> *args_4,Normal3<float> *args_5,
               Normal3<float> *args_6,Normal3<float> *args_7,Vector3<float> *args_8,
               Vector3<float> *args_9,Normal3<float> *args_10,Normal3<float> *args_11,char **args_12
               ,char **args_13,Vector3<float> *args_14,Vector3<float> *args_15,float *args_16,
               float *args_17,float *args_18,float *args_19,int *args_20)

{
  long lVar1;
  ulong uVar2;
  char **in_RCX;
  char **in_RDX;
  string *unaff_RBX;
  float *in_RSI;
  string *in_RDI;
  Vector3<float> *in_R8;
  Vector3<float> *in_stack_00000010;
  Normal3<float> *in_stack_00000018;
  Normal3<float> *in_stack_00000020;
  Normal3<float> *in_stack_00000028;
  Vector3<float> *in_stack_00000030;
  Vector3<float> *in_stack_00000038;
  Normal3<float> *in_stack_00000040;
  Normal3<float> *in_stack_00000048;
  char **in_stack_00000050;
  char **in_stack_00000058;
  Vector3<float> *in_stack_00000060;
  Vector3<float> *in_stack_00000068;
  float *in_stack_00000070;
  float *in_stack_00000078;
  float *in_stack_00000080;
  float *in_stack_00000088;
  int *in_stack_00000090;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Vector3<float> *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcc0;
  char **in_stack_fffffffffffffcc8;
  char **in_stack_fffffffffffffcd0;
  Vector3<float> *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  int line;
  char *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  LogLevel level;
  string local_288 [32];
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [413];
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [40];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(level,in_stack_fffffffffffffd48,line,in_stack_fffffffffffffd38);
  }
  if ((bool)local_83) {
    LogFatal(level,in_stack_fffffffffffffd48,line,in_stack_fffffffffffffd38);
  }
  if ((local_82 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      LogFatal(level,in_stack_fffffffffffffd48,line,in_stack_fffffffffffffd38);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Vector3<float>const&>(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    std::__cxx11::string::operator+=(in_RDI,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    pbrt::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_248 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::operator+=(in_RDI,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            (unaff_RBX,(char *)in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_stack_00000010,in_stack_00000018
             ,in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
             in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,
             in_stack_00000080,in_stack_00000088,in_stack_00000090);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}